

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void do_cmd_choose_race(command_conflict *cmd)

{
  player *p;
  player_race *r;
  guid local_14;
  command_conflict *pcStack_10;
  wchar_t choice;
  command_conflict *cmd_local;
  
  pcStack_10 = cmd;
  cmd_get_arg_choice((command *)cmd,"choice",(int *)&local_14);
  p = player;
  r = player_id2race(local_14);
  player_generate(p,r,(player_class *)0x0,false);
  reset_stats(stats,points_spent,points_inc,&points_left,false);
  generate_stats(stats,points_spent,points_inc,&points_left);
  rolled_stats = false;
  return;
}

Assistant:

void do_cmd_choose_race(struct command *cmd)
{
	int choice;
	cmd_get_arg_choice(cmd, "choice", &choice);
	player_generate(player, player_id2race(choice), NULL, false);

	reset_stats(stats, points_spent, points_inc, &points_left, false);
	generate_stats(stats, points_spent, points_inc, &points_left);
	rolled_stats = false;
}